

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O1

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  size_t _elemsize;
  Mat *pMVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  pointer pMVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  void *pvVar13;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = pMVar6->dims;
  _elemsize = pMVar6->elemsize;
  if (uVar4 == 1) {
    lVar5 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar5 == 0) {
      iVar7 = 0;
    }
    else {
      lVar5 = lVar5 >> 6;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      piVar9 = &pMVar6->w;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + *piVar9;
        piVar9 = piVar9 + 0x10;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar2,iVar7,_elemsize,opt->blob_allocator);
    pvVar13 = pMVar2->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar2->c * pMVar2->cstep == 0) {
      return -100;
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar6) {
      lVar5 = 0;
      uVar11 = 0;
      do {
        lVar10 = (long)*(int *)((long)&pMVar6->w + lVar5);
        memcpy(pvVar13,*(void **)((long)&pMVar6->data + lVar5),_elemsize * lVar10);
        pvVar13 = (void *)((long)pvVar13 + lVar10 * 4);
        uVar11 = uVar11 + 1;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x40;
      } while (uVar11 < (ulong)((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 6)
              );
    }
  }
  else {
    uVar1 = this->axis;
    if ((uVar4 ^ 2) == 0 && uVar1 == 0) {
      iVar7 = pMVar6->w;
      lVar5 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6;
      if (lVar5 == 0) {
        iVar3 = 0;
      }
      else {
        lVar5 = lVar5 >> 6;
        lVar5 = lVar5 + (ulong)(lVar5 == 0);
        piVar9 = &pMVar6->h;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + *piVar9;
          piVar9 = piVar9 + 0x10;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,iVar7,iVar3,_elemsize,opt->blob_allocator);
      pvVar13 = pMVar2->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar6) {
        lVar5 = 0;
        uVar11 = 0;
        do {
          lVar10 = (long)*(int *)((long)&pMVar6->h + lVar5) * (long)iVar7;
          memcpy(pvVar13,*(void **)((long)&pMVar6->data + lVar5),_elemsize * lVar10);
          pvVar13 = (void *)((long)pvVar13 + lVar10 * 4);
          uVar11 = uVar11 + 1;
          pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0x40;
        } while (uVar11 < (ulong)((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >>
                                 6));
        return 0;
      }
    }
    else if ((uVar4 ^ 2) == 0 && (uVar1 ^ 1) == 0) {
      iVar7 = pMVar6->h;
      lVar5 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6;
      if (lVar5 == 0) {
        iVar3 = 0;
      }
      else {
        lVar5 = lVar5 >> 6;
        lVar5 = lVar5 + (ulong)(lVar5 == 0);
        piVar9 = &pMVar6->w;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + *piVar9;
          piVar9 = piVar9 + 0x10;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,iVar3,iVar7,_elemsize,opt->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      if (0 < iVar7) {
        iVar3 = 0;
        do {
          pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish != pMVar6) {
            pvVar13 = (void *)((long)pMVar2->w * (long)iVar3 * pMVar2->elemsize + (long)pMVar2->data
                              );
            lVar5 = 0x2c;
            uVar11 = 0;
            do {
              lVar10 = (long)*(int *)((long)&pMVar6->data + lVar5);
              memcpy(pvVar13,(void *)(lVar10 * iVar3 * *(long *)((long)pMVar6 + lVar5 + -0x1c) +
                                     *(long *)((long)pMVar6 + lVar5 + -0x2c)),lVar10 * _elemsize);
              pvVar13 = (void *)((long)pvVar13 + (long)*(int *)((long)&pMVar6->data + lVar5) * 4);
              uVar11 = uVar11 + 1;
              pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              lVar5 = lVar5 + 0x40;
            } while (uVar11 < (ulong)((long)(bottom_blobs->
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pMVar6 >> 6));
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 != iVar7);
        return 0;
      }
    }
    else {
      uVar4 = uVar4 ^ 3;
      if (uVar4 == 0 && uVar1 == 0) {
        lVar5 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6;
        if (lVar5 == 0) {
          iVar7 = 0;
        }
        else {
          lVar5 = lVar5 >> 6;
          lVar5 = lVar5 + (ulong)(lVar5 == 0);
          piVar9 = &pMVar6->c;
          iVar7 = 0;
          do {
            iVar7 = iVar7 + *piVar9;
            piVar9 = piVar9 + 0x10;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar2,pMVar6->w,pMVar6->h,iVar7,_elemsize,opt->blob_allocator);
        if (pMVar2->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar2->c * pMVar2->cstep == 0) {
          return -100;
        }
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar6) {
          lVar5 = 0x38;
          iVar7 = 0;
          uVar11 = 0;
          do {
            iVar3 = *(int *)((long)pMVar6 + lVar5 + -4);
            memcpy((void *)(pMVar2->cstep * (long)iVar7 * pMVar2->elemsize + (long)pMVar2->data),
                   *(void **)((long)pMVar6 + lVar5 + -0x38),
                   (long)(*(int *)((long)&pMVar6->data + lVar5) * iVar3) * _elemsize);
            iVar7 = iVar7 + iVar3;
            uVar11 = uVar11 + 1;
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar5 = lVar5 + 0x40;
          } while (uVar11 < (ulong)((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6
                                   >> 6));
        }
      }
      else if ((uVar1 ^ 1) == 0 && uVar4 == 0) {
        uVar4 = pMVar6->c;
        lVar5 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6;
        if (lVar5 == 0) {
          iVar7 = 0;
        }
        else {
          lVar5 = lVar5 >> 6;
          lVar5 = lVar5 + (ulong)(lVar5 == 0);
          piVar9 = &pMVar6->h;
          iVar7 = 0;
          do {
            iVar7 = iVar7 + *piVar9;
            piVar9 = piVar9 + 0x10;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar2,pMVar6->w,iVar7,uVar4,_elemsize,opt->blob_allocator);
        if (pMVar2->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar2->c * pMVar2->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar4) {
          uVar11 = 0;
          do {
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar6) {
              pvVar13 = (void *)(pMVar2->cstep * uVar11 * pMVar2->elemsize + (long)pMVar2->data);
              lVar5 = 0x38;
              uVar12 = 0;
              do {
                lVar10 = (long)*(int *)((long)pMVar6 + lVar5 + -8) *
                         (long)*(int *)((long)pMVar6 + lVar5 + -0xc);
                memcpy(pvVar13,(void *)(*(long *)((long)&pMVar6->data + lVar5) * uVar11 *
                                        *(long *)((long)pMVar6 + lVar5 + -0x28) +
                                       *(long *)((long)pMVar6 + lVar5 + -0x38)),_elemsize * lVar10);
                pvVar13 = (void *)((long)pvVar13 + lVar10 * 4);
                uVar12 = uVar12 + 1;
                pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar5 = lVar5 + 0x40;
              } while (uVar12 < (ulong)((long)(bottom_blobs->
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pMVar6 >> 6));
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar4);
          return 0;
        }
      }
      else if (uVar4 == 0 && uVar1 == 2) {
        iVar7 = pMVar6->h;
        uVar4 = pMVar6->c;
        lVar5 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6;
        if (lVar5 == 0) {
          iVar3 = 0;
        }
        else {
          lVar5 = lVar5 >> 6;
          lVar5 = lVar5 + (ulong)(lVar5 == 0);
          piVar9 = &pMVar6->w;
          iVar3 = 0;
          do {
            iVar3 = iVar3 + *piVar9;
            piVar9 = piVar9 + 0x10;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar2,iVar3,iVar7,uVar4,_elemsize,opt->blob_allocator);
        if (pMVar2->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar2->c * pMVar2->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar4) {
          uVar11 = 0;
          do {
            if (0 < iVar7) {
              pvVar13 = (void *)(pMVar2->cstep * uVar11 * pMVar2->elemsize + (long)pMVar2->data);
              iVar3 = 0;
              do {
                pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish != pMVar6) {
                  lVar5 = 0x38;
                  uVar12 = 0;
                  do {
                    lVar8 = (long)*(int *)((long)pMVar6 + lVar5 + -0xc);
                    lVar10 = *(long *)((long)pMVar6 + lVar5 + -0x28);
                    memcpy(pvVar13,(void *)(lVar8 * iVar3 * lVar10 +
                                           *(long *)((long)&pMVar6->data + lVar5) * uVar11 * lVar10
                                           + *(long *)((long)pMVar6 + lVar5 + -0x38)),
                           _elemsize * lVar8);
                    pvVar13 = (void *)((long)pvVar13 +
                                      (long)*(int *)((long)pMVar6 + lVar5 + -0xc) * 4);
                    uVar12 = uVar12 + 1;
                    pMVar6 = (bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    lVar5 = lVar5 + 0x40;
                  } while (uVar12 < (ulong)((long)(bottom_blobs->
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pMVar6 >> 6));
                }
                iVar3 = iVar3 + 1;
              } while (iVar3 != iVar7);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar4);
          return 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;

    if (dims == 1) // axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            int size = bottom_blob.cstep * channels;

            const float* ptr = bottom_blob;
            float* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total height
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                for (size_t b=0; b<bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w;
                }
            }
        }

        return 0;
    }

    return 0;
}